

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_allocate_tile_element_cstr_index(opj_j2k_t *p_j2k)

{
  opj_tile_index_t *poVar1;
  opj_codestream_index_t *poVar2;
  void *pvVar3;
  OPJ_BOOL OVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar5 = (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
  p_j2k->cstr_index->nb_of_tiles = uVar5;
  poVar1 = (opj_tile_index_t *)opj_calloc((ulong)uVar5,0x38);
  p_j2k->cstr_index->tile_index = poVar1;
  if (poVar1 == (opj_tile_index_t *)0x0) {
LAB_00110708:
    OVar4 = 0;
  }
  else {
    poVar2 = p_j2k->cstr_index;
    OVar4 = 1;
    if (poVar2->nb_of_tiles != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        poVar1 = poVar2->tile_index;
        *(undefined4 *)((long)&poVar1->maxmarknum + lVar6) = 100;
        *(undefined4 *)((long)&poVar1->marknum + lVar6) = 0;
        pvVar3 = opj_calloc(100,0x18);
        *(void **)((long)&p_j2k->cstr_index->tile_index->marker + lVar6) = pvVar3;
        if (pvVar3 == (void *)0x0) goto LAB_00110708;
        uVar7 = uVar7 + 1;
        poVar2 = p_j2k->cstr_index;
        lVar6 = lVar6 + 0x38;
      } while (uVar7 < poVar2->nb_of_tiles);
    }
  }
  return OVar4;
}

Assistant:

static OPJ_BOOL opj_j2k_allocate_tile_element_cstr_index(opj_j2k_t *p_j2k)
{
    OPJ_UINT32 it_tile = 0;

    p_j2k->cstr_index->nb_of_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th;
    p_j2k->cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(
                                        p_j2k->cstr_index->nb_of_tiles, sizeof(opj_tile_index_t));
    if (!p_j2k->cstr_index->tile_index) {
        return OPJ_FALSE;
    }

    for (it_tile = 0; it_tile < p_j2k->cstr_index->nb_of_tiles; it_tile++) {
        p_j2k->cstr_index->tile_index[it_tile].maxmarknum = 100;
        p_j2k->cstr_index->tile_index[it_tile].marknum = 0;
        p_j2k->cstr_index->tile_index[it_tile].marker = (opj_marker_info_t*)
                opj_calloc(p_j2k->cstr_index->tile_index[it_tile].maxmarknum,
                           sizeof(opj_marker_info_t));
        if (!p_j2k->cstr_index->tile_index[it_tile].marker) {
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}